

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm_include.c
# Opt level: O0

int emulate_compare(int code,reg_type *src1,reg_type *src2)

{
  reg_type *src2_local;
  reg_type *src1_local;
  int code_local;
  uint local_4;
  
  switch(code) {
  case 0:
    local_4 = (uint)((src1->u).c.c == (src2->u).c.c);
    break;
  case 1:
    local_4 = (uint)((src1->u).c.c == (src2->u).c.c);
    break;
  case 2:
    local_4 = (uint)((src1->u).s.s == (src2->u).s.s);
    break;
  case 3:
    local_4 = (uint)((src1->u).s.s == (src2->u).s.s);
    break;
  case 4:
    local_4 = (uint)((src1->u).i.i == (src2->u).i.i);
    break;
  case 5:
    local_4 = (uint)((src1->u).i.i == (src2->u).i.i);
    break;
  case 6:
    local_4 = (uint)((intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src1->u ==
                    (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src2->u);
    break;
  case 7:
    local_4 = (uint)((intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src1->u ==
                    (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src2->u);
    break;
  case 8:
    local_4 = (uint)((intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src1->u ==
                    (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src2->u);
    break;
  case 9:
    local_4 = (uint)(*(float *)&src1->u == *(float *)&src2->u);
    break;
  case 10:
    local_4 = (uint)((double)src1->u == (double)src2->u);
    break;
  case 0xb:
    local_4 = (uint)((src2->u).c.c <= (src1->u).c.c);
    break;
  case 0xc:
    local_4 = (uint)((byte)(src2->u).c.c <= (byte)(src1->u).c.c);
    break;
  case 0xd:
    local_4 = (uint)((src2->u).s.s <= (src1->u).s.s);
    break;
  case 0xe:
    local_4 = (uint)((ushort)(src2->u).s.s <= (ushort)(src1->u).s.s);
    break;
  case 0xf:
    local_4 = (uint)((src2->u).i.i <= (src1->u).i.i);
    break;
  case 0x10:
    local_4 = (uint)((uint)(src2->u).i.i <= (uint)(src1->u).i.i);
    break;
  case 0x11:
    local_4 = (uint)((long)src2->u <= (long)src1->u);
    break;
  case 0x12:
    local_4 = (uint)((ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u <=
                    (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u);
    break;
  case 0x13:
    local_4 = (uint)((ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u <=
                    (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u);
    break;
  case 0x14:
    local_4 = (uint)(*(float *)&src2->u <= *(float *)&src1->u);
    break;
  case 0x15:
    local_4 = (uint)((double)src2->u <= (double)src1->u);
    break;
  case 0x16:
    local_4 = (uint)((src2->u).c.c < (src1->u).c.c);
    break;
  case 0x17:
    local_4 = (uint)((byte)(src2->u).c.c < (byte)(src1->u).c.c);
    break;
  case 0x18:
    local_4 = (uint)((src2->u).s.s < (src1->u).s.s);
    break;
  case 0x19:
    local_4 = (uint)((ushort)(src2->u).s.s < (ushort)(src1->u).s.s);
    break;
  case 0x1a:
    local_4 = (uint)((src2->u).i.i < (src1->u).i.i);
    break;
  case 0x1b:
    local_4 = (uint)((uint)(src2->u).i.i < (uint)(src1->u).i.i);
    break;
  case 0x1c:
    local_4 = (uint)((long)src2->u < (long)src1->u);
    break;
  case 0x1d:
    local_4 = (uint)((ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u <
                    (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u);
    break;
  case 0x1e:
    local_4 = (uint)((ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u <
                    (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u);
    break;
  case 0x1f:
    local_4 = (uint)(*(float *)&src2->u <= *(float *)&src1->u &&
                    *(float *)&src1->u != *(float *)&src2->u);
    break;
  case 0x20:
    local_4 = (uint)((double)src2->u <= *(double *)&(src1->u).c &&
                    *(double *)&(src1->u).c != (double)src2->u);
    break;
  case 0x21:
    local_4 = (uint)((src1->u).c.c <= (src2->u).c.c);
    break;
  case 0x22:
    local_4 = (uint)((byte)(src1->u).c.c <= (byte)(src2->u).c.c);
    break;
  case 0x23:
    local_4 = (uint)((src1->u).s.s <= (src2->u).s.s);
    break;
  case 0x24:
    local_4 = (uint)((ushort)(src1->u).s.s <= (ushort)(src2->u).s.s);
    break;
  case 0x25:
    local_4 = (uint)((src1->u).i.i <= (src2->u).i.i);
    break;
  case 0x26:
    local_4 = (uint)((uint)(src1->u).i.i <= (uint)(src2->u).i.i);
    break;
  case 0x27:
    local_4 = (uint)((long)src1->u <= (long)src2->u);
    break;
  case 0x28:
    local_4 = (uint)((ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u <=
                    (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u);
    break;
  case 0x29:
    local_4 = (uint)((ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u <=
                    (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u);
    break;
  case 0x2a:
    local_4 = (uint)(*(float *)&src1->u <= *(float *)&src2->u);
    break;
  case 0x2b:
    local_4 = (uint)((double)src1->u <= (double)src2->u);
    break;
  case 0x2c:
    local_4 = (uint)((src1->u).c.c < (src2->u).c.c);
    break;
  case 0x2d:
    local_4 = (uint)((byte)(src1->u).c.c < (byte)(src2->u).c.c);
    break;
  case 0x2e:
    local_4 = (uint)((src1->u).s.s < (src2->u).s.s);
    break;
  case 0x2f:
    local_4 = (uint)((ushort)(src1->u).s.s < (ushort)(src2->u).s.s);
    break;
  case 0x30:
    local_4 = (uint)((src1->u).i.i < (src2->u).i.i);
    break;
  case 0x31:
    local_4 = (uint)((uint)(src1->u).i.i < (uint)(src2->u).i.i);
    break;
  case 0x32:
    local_4 = (uint)((long)src1->u < (long)src2->u);
    break;
  case 0x33:
    local_4 = (uint)((ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u <
                    (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u);
    break;
  case 0x34:
    local_4 = (uint)((ulong)*(anon_struct_8_1_54a3980c_for_l *)&src1->u <
                    (ulong)*(anon_struct_8_1_54a3980c_for_l *)&src2->u);
    break;
  case 0x35:
    local_4 = (uint)(*(float *)&src1->u < *(float *)&src2->u);
    break;
  case 0x36:
    local_4 = (uint)((double)src1->u < (double)src2->u);
    break;
  case 0x37:
    local_4 = (uint)((src1->u).c.c != (src2->u).c.c);
    break;
  case 0x38:
    local_4 = (uint)((src1->u).c.c != (src2->u).c.c);
    break;
  case 0x39:
    local_4 = (uint)((src1->u).s.s != (src2->u).s.s);
    break;
  case 0x3a:
    local_4 = (uint)((src1->u).s.s != (src2->u).s.s);
    break;
  case 0x3b:
    local_4 = (uint)((src1->u).i.i != (src2->u).i.i);
    break;
  case 0x3c:
    local_4 = (uint)((src1->u).i.i != (src2->u).i.i);
    break;
  case 0x3d:
    local_4 = (uint)((intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src1->u !=
                    (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src2->u);
    break;
  case 0x3e:
    local_4 = (uint)((intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src1->u !=
                    (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src2->u);
    break;
  case 0x3f:
    local_4 = (uint)((intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src1->u !=
                    (intptr_t)*(anon_struct_8_1_54a3980c_for_l *)&src2->u);
    break;
  case 0x40:
    local_4 = (uint)(*(float *)&src1->u != *(float *)&src2->u);
    break;
  case 0x41:
    local_4 = (uint)((double)src1->u != (double)src2->u);
    break;
  default:
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int emulate_compare(int code, struct reg_type *src1, struct reg_type *src2)
{
    switch(code) {
	  case dill_jmp_ceqc:  return ( src1->u.c.c) == ( src2->u.c.c);
	  case dill_jmp_cequc:  return ( src1->u.uc.uc) == ( src2->u.uc.uc);
	  case dill_jmp_ceqs:  return ( src1->u.s.s) == ( src2->u.s.s);
	  case dill_jmp_cequs:  return ( src1->u.us.us) == ( src2->u.us.us);
	  case dill_jmp_ceqi:  return ( src1->u.i.i) == ( src2->u.i.i);
	  case dill_jmp_cequ:  return ( src1->u.u.u) == ( src2->u.u.u);
	  case dill_jmp_cequl:  return ( src1->u.ul.ul) == ( src2->u.ul.ul);
	  case dill_jmp_ceql:  return ( src1->u.l.l) == ( src2->u.l.l);
	  case dill_jmp_ceqp:  return ((char*) src1->u.p.p) == ((char*) src2->u.p.p);
	  case dill_jmp_ceqd:  return ( src1->u.d.d) == ( src2->u.d.d);
	  case dill_jmp_ceqf:  return ( src1->u.f.f) == ( src2->u.f.f);
	  case dill_jmp_cgec:  return ( src1->u.c.c) >= ( src2->u.c.c);
	  case dill_jmp_cgeuc:  return ( src1->u.uc.uc) >= ( src2->u.uc.uc);
	  case dill_jmp_cges:  return ( src1->u.s.s) >= ( src2->u.s.s);
	  case dill_jmp_cgeus:  return ( src1->u.us.us) >= ( src2->u.us.us);
	  case dill_jmp_cgei:  return ( src1->u.i.i) >= ( src2->u.i.i);
	  case dill_jmp_cgeu:  return ( src1->u.u.u) >= ( src2->u.u.u);
	  case dill_jmp_cgeul:  return ( src1->u.ul.ul) >= ( src2->u.ul.ul);
	  case dill_jmp_cgel:  return ( src1->u.l.l) >= ( src2->u.l.l);
	  case dill_jmp_cgep:  return ((char*) src1->u.p.p) >= ((char*) src2->u.p.p);
	  case dill_jmp_cged:  return ( src1->u.d.d) >= ( src2->u.d.d);
	  case dill_jmp_cgef:  return ( src1->u.f.f) >= ( src2->u.f.f);
	  case dill_jmp_cgtc:  return ( src1->u.c.c) > ( src2->u.c.c);
	  case dill_jmp_cgtuc:  return ( src1->u.uc.uc) > ( src2->u.uc.uc);
	  case dill_jmp_cgts:  return ( src1->u.s.s) > ( src2->u.s.s);
	  case dill_jmp_cgtus:  return ( src1->u.us.us) > ( src2->u.us.us);
	  case dill_jmp_cgti:  return ( src1->u.i.i) > ( src2->u.i.i);
	  case dill_jmp_cgtu:  return ( src1->u.u.u) > ( src2->u.u.u);
	  case dill_jmp_cgtul:  return ( src1->u.ul.ul) > ( src2->u.ul.ul);
	  case dill_jmp_cgtl:  return ( src1->u.l.l) > ( src2->u.l.l);
	  case dill_jmp_cgtp:  return ((char*) src1->u.p.p) > ((char*) src2->u.p.p);
	  case dill_jmp_cgtd:  return ( src1->u.d.d) > ( src2->u.d.d);
	  case dill_jmp_cgtf:  return ( src1->u.f.f) > ( src2->u.f.f);
	  case dill_jmp_clec:  return ( src1->u.c.c) <= ( src2->u.c.c);
	  case dill_jmp_cleuc:  return ( src1->u.uc.uc) <= ( src2->u.uc.uc);
	  case dill_jmp_cles:  return ( src1->u.s.s) <= ( src2->u.s.s);
	  case dill_jmp_cleus:  return ( src1->u.us.us) <= ( src2->u.us.us);
	  case dill_jmp_clei:  return ( src1->u.i.i) <= ( src2->u.i.i);
	  case dill_jmp_cleu:  return ( src1->u.u.u) <= ( src2->u.u.u);
	  case dill_jmp_cleul:  return ( src1->u.ul.ul) <= ( src2->u.ul.ul);
	  case dill_jmp_clel:  return ( src1->u.l.l) <= ( src2->u.l.l);
	  case dill_jmp_clep:  return ((char*) src1->u.p.p) <= ((char*) src2->u.p.p);
	  case dill_jmp_cled:  return ( src1->u.d.d) <= ( src2->u.d.d);
	  case dill_jmp_clef:  return ( src1->u.f.f) <= ( src2->u.f.f);
	  case dill_jmp_cltc:  return ( src1->u.c.c) < ( src2->u.c.c);
	  case dill_jmp_cltuc:  return ( src1->u.uc.uc) < ( src2->u.uc.uc);
	  case dill_jmp_clts:  return ( src1->u.s.s) < ( src2->u.s.s);
	  case dill_jmp_cltus:  return ( src1->u.us.us) < ( src2->u.us.us);
	  case dill_jmp_clti:  return ( src1->u.i.i) < ( src2->u.i.i);
	  case dill_jmp_cltu:  return ( src1->u.u.u) < ( src2->u.u.u);
	  case dill_jmp_cltul:  return ( src1->u.ul.ul) < ( src2->u.ul.ul);
	  case dill_jmp_cltl:  return ( src1->u.l.l) < ( src2->u.l.l);
	  case dill_jmp_cltp:  return ((char*) src1->u.p.p) < ((char*) src2->u.p.p);
	  case dill_jmp_cltd:  return ( src1->u.d.d) < ( src2->u.d.d);
	  case dill_jmp_cltf:  return ( src1->u.f.f) < ( src2->u.f.f);
	  case dill_jmp_cnec:  return ( src1->u.c.c) != ( src2->u.c.c);
	  case dill_jmp_cneuc:  return ( src1->u.uc.uc) != ( src2->u.uc.uc);
	  case dill_jmp_cnes:  return ( src1->u.s.s) != ( src2->u.s.s);
	  case dill_jmp_cneus:  return ( src1->u.us.us) != ( src2->u.us.us);
	  case dill_jmp_cnei:  return ( src1->u.i.i) != ( src2->u.i.i);
	  case dill_jmp_cneu:  return ( src1->u.u.u) != ( src2->u.u.u);
	  case dill_jmp_cneul:  return ( src1->u.ul.ul) != ( src2->u.ul.ul);
	  case dill_jmp_cnel:  return ( src1->u.l.l) != ( src2->u.l.l);
	  case dill_jmp_cnep:  return ((char*) src1->u.p.p) != ((char*) src2->u.p.p);
	  case dill_jmp_cned:  return ( src1->u.d.d) != ( src2->u.d.d);
	  case dill_jmp_cnef:  return ( src1->u.f.f) != ( src2->u.f.f);
    }return 0;
}